

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

void __thiscall soplex::SPxDevexPR<double>::setupWeights(SPxDevexPR<double> *this,Type tp)

{
  long lVar1;
  VectorBase<double> *this_00;
  uint uVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  SPxSolverBase<double> *pSVar7;
  long lVar8;
  pointer pdVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  this_00 = &pSVar4->coWeights;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_00->val,(long)(pSVar4->thecovectors->set).thenum);
  auVar6 = _DAT_005f4040;
  auVar5 = _DAT_005f4030;
  pSVar7 = (this->super_SPxPricer<double>).thesolver;
  uVar2 = (pSVar7->thecovectors->set).thenum;
  uVar10 = (ulong)uVar2;
  if (tp == ENTER) {
    if (0 < (int)uVar2) {
      lVar8 = uVar10 - 1;
      auVar14._8_4_ = (int)lVar8;
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
      pdVar9 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar10 - 1);
      uVar10 = 0;
      auVar14 = auVar14 ^ _DAT_005f4040;
      do {
        auVar15._8_4_ = (int)uVar10;
        auVar15._0_8_ = uVar10;
        auVar15._12_4_ = (int)(uVar10 >> 0x20);
        auVar15 = (auVar15 | auVar5) ^ auVar6;
        if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                    auVar14._4_4_ < auVar15._4_4_) & 1)) {
          *pdVar9 = 2.0;
        }
        if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
            auVar15._12_4_ <= auVar14._12_4_) {
          pdVar9[-1] = 2.0;
        }
        uVar10 = uVar10 + 2;
        pdVar9 = pdVar9 + -2;
      } while ((uVar2 + 1 & 0xfffffffe) != uVar10);
    }
    std::vector<double,_std::allocator<double>_>::resize
              (&(pSVar4->weights).val,(long)(pSVar7->thevectors->set).thenum);
    auVar6 = _DAT_005f4040;
    auVar5 = _DAT_005f4030;
    pSVar7 = (this->super_SPxPricer<double>).thesolver;
    iVar3 = (pSVar7->thevectors->set).thenum;
    lVar8 = (long)iVar3;
    if (0 < lVar8) {
      lVar1 = lVar8 + -1;
      auVar12._8_4_ = (int)lVar1;
      auVar12._0_8_ = lVar1;
      auVar12._12_4_ = (int)((ulong)lVar1 >> 0x20);
      pdVar9 = (pSVar4->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar8 + -1;
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_005f4040;
      do {
        auVar16._8_4_ = (int)uVar10;
        auVar16._0_8_ = uVar10;
        auVar16._12_4_ = (int)(uVar10 >> 0x20);
        auVar14 = (auVar16 | auVar5) ^ auVar6;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *pdVar9 = 2.0;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          pdVar9[-1] = 2.0;
        }
        uVar10 = uVar10 + 2;
        pdVar9 = pdVar9 + -2;
      } while ((iVar3 + 1U & 0xfffffffe) != uVar10);
    }
  }
  else if (0 < (int)uVar2) {
    lVar8 = uVar10 - 1;
    auVar11._8_4_ = (int)lVar8;
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
    pdVar9 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + (uVar10 - 1);
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_005f4040;
    do {
      auVar13._8_4_ = (int)uVar10;
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = (int)(uVar10 >> 0x20);
      auVar14 = (auVar13 | auVar5) ^ auVar6;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        *pdVar9 = 1.0;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        pdVar9[-1] = 1.0;
      }
      uVar10 = uVar10 + 2;
      pdVar9 = pdVar9 + -2;
    } while ((uVar2 + 1 & 0xfffffffe) != uVar10);
  }
  pSVar7->weightsAreSetup = true;
  return;
}

Assistant:

void SPxDevexPR<R>::setupWeights(typename SPxSolverBase<R>::Type tp)
{
   int i;
   int coWeightSize = 0;
   int weightSize = 0;

   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(tp == SPxSolverBase<R>::ENTER)
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 2.0;

      weights.reDim(this->thesolver->coDim(), false);

      for(i = this->thesolver->coDim() - 1; i >= weightSize; --i)
         weights[i] = 2.0;
   }
   else
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 1.0;
   }

   this->thesolver->weightsAreSetup = true;
}